

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLatch.c
# Opt level: O3

int Abc_NtkCountSelfFeedLatches(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  long lVar4;
  
  pVVar2 = pNtk->vBoxes;
  if (pVVar2->nSize < 1) {
    iVar3 = 0;
  }
  else {
    lVar4 = 0;
    iVar3 = 0;
    do {
      if ((*(uint *)&((Abc_Obj_t *)pVVar2->pArray[lVar4])->field_0x14 & 0xf) == 8) {
        iVar1 = Abc_NtkLatchIsSelfFeed((Abc_Obj_t *)pVVar2->pArray[lVar4]);
        iVar3 = iVar3 + iVar1;
        pVVar2 = pNtk->vBoxes;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < pVVar2->nSize);
  }
  return iVar3;
}

Assistant:

int Abc_NtkCountSelfFeedLatches( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pLatch;
    int i, Counter;
    Counter = 0;
    Abc_NtkForEachLatch( pNtk, pLatch, i )
    {
//        if ( Abc_NtkLatchIsSelfFeed(pLatch) && Abc_ObjFanoutNum(pLatch) > 1 )
//            printf( "Fanouts = %d.\n", Abc_ObjFanoutNum(pLatch) );
        Counter += Abc_NtkLatchIsSelfFeed( pLatch );
    }
    return Counter;
}